

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genx.c
# Opt level: O2

genxWriter
genxNew(_func_void_ptr_void_ptr_int *alloc,_func_void_void_ptr_void_ptr *dealloc,void *userData)

{
  genxStatus *statusP;
  genxStatus gVar1;
  int iVar2;
  genxWriter w;
  undefined4 extraout_var;
  genxAttribute_conflict pgVar3;
  genxNamespace pgVar4;
  
  if (alloc == (_func_void_ptr_void_ptr_int *)0x0) {
    w = (genxWriter)malloc(0x10420);
  }
  else {
    w = (genxWriter)(*alloc)(userData,0x10420);
  }
  if (w != (genxWriter)0x0) {
    w->status = GENX_SUCCESS;
    w->sequence = SEQUENCE_NO_DOC;
    w->alloc = alloc;
    w->dealloc = dealloc;
    w->userData = userData;
    gVar1 = initPlist(w,&w->namespaces);
    if ((((gVar1 == GENX_SUCCESS) && (gVar1 = initPlist(w,&w->elements), gVar1 == GENX_SUCCESS)) &&
        (gVar1 = initPlist(w,&w->attributes), gVar1 == GENX_SUCCESS)) &&
       ((gVar1 = initPlist(w,&w->prefixes), gVar1 == GENX_SUCCESS &&
        (gVar1 = initPlist(w,&w->stack), gVar1 == GENX_SUCCESS)))) {
      gVar1 = initCollector(w,&(w->arec).value);
      w->status = gVar1;
      if (gVar1 == GENX_SUCCESS) {
        statusP = &w->status;
        iVar2 = copy((EVP_PKEY_CTX *)w,(EVP_PKEY_CTX *)0x208b3a);
        w->empty = (utf8)CONCAT44(extraout_var,iVar2);
        if ((utf8)CONCAT44(extraout_var,iVar2) == (utf8)0x0) {
          *statusP = GENX_ALLOC_FAILED;
        }
        else {
          pgVar3 = declareAttribute(w,(genxNamespace)0x0,(constUtf8)"xmlns",(constUtf8)0x0,statusP);
          w->xmlnsEquals = pgVar3;
          if (pgVar3 == (genxAttribute_conflict)0x0) {
            return (genxWriter)0x0;
          }
          if (*statusP == GENX_SUCCESS) {
            w->defaultNsDeclared = 0;
            w->nextPrefix = 1;
            genxSetCharProps(w->xmlChars);
            w->etext[0] = "Success";
            w->etext[1] = "Bad UTF8";
            w->etext[2] = "Non XML Character";
            w->etext[3] = "Bad NAME";
            w->etext[4] = "Memory allocation failed";
            w->etext[5] = "Bad namespace name";
            w->etext[6] = "Internal error";
            w->etext[7] = "Duplicate prefix";
            w->etext[8] = "Call out of sequence";
            w->etext[9] = "No Start-tag for EndElement call";
            w->etext[10] = "I/O error";
            w->etext[0xb] = "Missing attribute value";
            w->etext[0xc] = "Malformed comment body";
            w->etext[0xe] = "?> in PI";
            w->etext[0xd] = "Target of PI matches [xX][mM][lL]";
            w->etext[0xf] = "Same attribute specified more than once";
            w->etext[0x10] = "Attribute cannot be in default namespace";
            w->etext[0x11] = "Declared namespace twice with different prefixes on one element.";
            w->etext[0x12] = "Declared a default namespace on an element which is in no namespace";
            pgVar4 = genxDeclareNamespace
                               (w,(constUtf8)"http://www.w3.org/XML/1998/namespace","xml",statusP);
            if (pgVar4 != (genxNamespace)0x0) {
              pgVar4->declCount = 1;
              pgVar4->declaration = pgVar4->defaultDecl;
              return w;
            }
          }
        }
      }
    }
  }
  return (genxWriter)0x0;
}

Assistant:

genxWriter genxNew(void * (* alloc)(void * userData, int bytes),
		   void (* dealloc)(void * userData, void * data),
		   void * userData)
{
  genxWriter w;
  genxNamespace xml;

  if (alloc)
    w = (genxWriter) (*alloc)(userData, sizeof(struct genxWriter_rec));
  else
    w = (genxWriter) malloc(sizeof(struct genxWriter_rec));

  if (w == NULL)
    return NULL;

  w->status = GENX_SUCCESS;
  w->alloc = alloc;
  w->dealloc = dealloc;
  w->userData = userData;
  w->sequence = SEQUENCE_NO_DOC;

  if (initPlist(w, &w->namespaces) != GENX_SUCCESS ||
      initPlist(w, &w->elements) != GENX_SUCCESS ||
      initPlist(w, &w->attributes) != GENX_SUCCESS ||
      initPlist(w, &w->prefixes) != GENX_SUCCESS ||
      initPlist(w, &w->stack) != GENX_SUCCESS)
    return NULL;

  if ((w->status = initCollector(w, &w->arec.value)) != GENX_SUCCESS)
    return NULL;

  if ((w->empty = copy(w, (utf8) "")) == NULL)
  {
    w->status = GENX_ALLOC_FAILED;
    return NULL;
  }

  w->xmlnsEquals = declareAttribute(w, NULL, (utf8) "xmlns", NULL, &w->status);
  if (w->xmlnsEquals == NULL || w->status != GENX_SUCCESS)
    return NULL;
  w->defaultNsDeclared = False;

  w->nextPrefix = 1;

  genxSetCharProps(w->xmlChars);

  w->etext[GENX_SUCCESS] = "Success";
  w->etext[GENX_BAD_UTF8] = "Bad UTF8";
  w->etext[GENX_NON_XML_CHARACTER] = "Non XML Character";
  w->etext[GENX_BAD_NAME] = "Bad NAME";
  w->etext[GENX_ALLOC_FAILED] = "Memory allocation failed";
  w->etext[GENX_BAD_NAMESPACE_NAME] = "Bad namespace name";
  w->etext[GENX_INTERNAL_ERROR] = "Internal error";
  w->etext[GENX_DUPLICATE_PREFIX] = "Duplicate prefix";
  w->etext[GENX_SEQUENCE_ERROR] = "Call out of sequence";
  w->etext[GENX_NO_START_TAG] = "No Start-tag for EndElement call";
  w->etext[GENX_IO_ERROR] = "I/O error";
  w->etext[GENX_MISSING_VALUE] = "Missing attribute value";
  w->etext[GENX_MALFORMED_COMMENT] = "Malformed comment body";
  w->etext[GENX_MALFORMED_PI] = "?> in PI";
  w->etext[GENX_XML_PI_TARGET] = "Target of PI matches [xX][mM][lL]";
  w->etext[GENX_DUPLICATE_ATTRIBUTE] =
    "Same attribute specified more than once";
  w->etext[GENX_ATTRIBUTE_IN_DEFAULT_NAMESPACE] =
    "Attribute cannot be in default namespace";
  w->etext[GENX_DUPLICATE_NAMESPACE] =
    "Declared namespace twice with different prefixes on one element.";
  w->etext[GENX_BAD_DEFAULT_DECLARATION] =
    "Declared a default namespace on an element which is in no namespace";

  /* the xml: namespace is pre-wired */
  xml = genxDeclareNamespace(w, (utf8) "http://www.w3.org/XML/1998/namespace",
			     (utf8) "xml", &w->status);
  if (xml == NULL)
    return NULL;
  xml->declCount = 1;
  xml->declaration = xml->defaultDecl;

  return w;
}